

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

void __thiscall crnlib::crn_comp::optimize_alpha_selectors(crn_comp *this)

{
  vector<unsigned_short> *remapping;
  uint uVar1;
  uint16 i;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  vector<unsigned_short> indices;
  vector<unsigned_long_long> selectors;
  uint8 D6 [4096];
  elemental_vector local_1058;
  elemental_vector local_1048;
  byte abStack_1038 [4104];
  
  remapping = this->m_selector_remaping + 1;
  uVar1 = (this->m_alpha_selectors).m_size;
  uVar9 = uVar1 & 0xffff;
  uVar4 = this->m_selector_remaping[1].m_size;
  if (uVar4 != uVar9) {
    if (uVar4 <= uVar9) {
      if (this->m_selector_remaping[1].m_capacity < uVar9) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)remapping,uVar9,uVar4 + 1 == uVar9,2,(object_mover)0x0,false)
        ;
      }
      uVar4 = this->m_selector_remaping[1].m_size;
      memset(this->m_selector_remaping[1].m_p + uVar4,0,(ulong)(uVar9 - uVar4) * 2);
    }
    this->m_selector_remaping[1].m_size = uVar9;
  }
  uVar2 = 0;
  do {
    abStack_1038[uVar2] =
         (&DAT_001a334b)[(uint)(uVar2 >> 3) & 7 ^ (uint)(uVar2 >> 9) & 0x7fffff] +
         (&DAT_001a334b)[((uint)(uVar2 >> 6) & 0x3ffffff ^ (uint)uVar2) & 7];
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x1000);
  local_1048.m_p = (void *)0x0;
  local_1048.m_size = 0;
  local_1048.m_capacity = 0;
  if (uVar9 == 0) {
    local_1058.m_p = (void *)0x0;
    local_1058.m_size = 0;
    local_1058.m_capacity = 0;
  }
  else {
    elemental_vector::increase_capacity(&local_1048,uVar9,uVar9 == 1,8,(object_mover)0x0,false);
    memset((void *)((local_1048._8_8_ & 0xffffffff) * 8 + (long)local_1048.m_p),0,
           (ulong)(uVar9 - local_1048.m_size) << 3);
    local_1048._8_8_ = CONCAT44(local_1048.m_capacity,uVar1) & 0xffffffff0000ffff;
    local_1058.m_p = (void *)0x0;
    local_1058.m_size = 0;
    local_1058.m_capacity = 0;
    elemental_vector::increase_capacity(&local_1058,uVar9,uVar9 == 1,2,(object_mover)0x0,false);
    memset((void *)((local_1058._8_8_ & 0xffffffff) * 2 + (long)local_1058.m_p),0,
           (ulong)(uVar9 - local_1058.m_size) * 2);
    local_1058._8_8_ = CONCAT44(local_1058.m_capacity,uVar1) & 0xffffffff0000ffff;
    uVar2 = 0;
    do {
      *(unsigned_long_long *)((long)local_1048.m_p + uVar2 * 8) =
           (this->m_alpha_selectors).m_p[uVar2];
      *(short *)((long)local_1058.m_p + uVar2 * 2) = (short)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar9 != uVar2);
  }
  if ((short)uVar1 != 0) {
    uVar3 = (ulong)(uVar1 & 0xffff);
    uVar2 = 0;
    do {
      uVar4 = 0xffffffff;
      uVar5 = 0;
      uVar9 = 0;
      do {
        uVar7 = *(long *)((long)local_1048.m_p + uVar5 * 8) << 6;
        lVar8 = 8;
        uVar6 = 0;
        uVar10 = uVar2;
        do {
          uVar6 = uVar6 + abStack_1038[(uint)uVar10 & 0x3f | (uint)uVar7 & 0xfc0];
          uVar7 = uVar7 >> 6;
          uVar10 = uVar10 >> 6;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
        if (uVar6 < uVar4) {
          uVar4 = uVar6;
          uVar9 = (uint)uVar5;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar3);
      uVar10 = (ulong)((uVar9 & 0xffff) * 8);
      uVar2 = *(ulong *)((long)local_1048.m_p + uVar10);
      uVar5 = (ulong)((uVar9 & 0xffff) * 2);
      remapping->m_p[*(ushort *)((long)local_1058.m_p + uVar5)] = (short)uVar1 - (short)uVar3;
      *(undefined8 *)((long)local_1048.m_p + uVar10) =
           *(undefined8 *)((long)local_1048.m_p + uVar3 * 8 + -8);
      *(undefined2 *)((long)local_1058.m_p + uVar5) =
           *(undefined2 *)((long)local_1058.m_p + uVar3 * 2 + -2);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  pack_alpha_selectors(this,&this->m_packed_alpha_selectors,remapping);
  if (local_1058.m_p != (void *)0x0) {
    crnlib_free(local_1058.m_p);
  }
  if (local_1048.m_p != (void *)0x0) {
    crnlib_free(local_1048.m_p);
  }
  return;
}

Assistant:

void crn_comp::optimize_alpha_selectors() {
  crnlib::vector<uint16>& remapping = m_selector_remaping[cAlpha0];
  uint16 n = m_alpha_selectors.size();
  remapping.resize(n);

  uint8 d[] = {0, 2, 3, 3, 5, 5, 4, 4};

  uint8 D6[0x1000];
  for (uint16 i = 0; i < 0x1000; i++)
    D6[i] = d[(i ^ i >> 6) & 7] + d[(i >> 3 ^ i >> 9) & 7];

  crnlib::vector<uint64> selectors(n);
  crnlib::vector<uint16> indices(n);
  for (uint16 i = 0; i < n; i++) {
    selectors[i] = m_alpha_selectors[i];
    indices[i] = i;
  }
  uint64 selected_selector = 0;
  for (uint16 left = n; left;) {
    uint16 selected_index = 0;
    uint min_error = cUINT32_MAX;
    for (uint16 i = 0; i < left; i++) {
      uint error = 0;
      for (uint64 selector = selectors[i] << 6, delta_selector = selected_selector, j = 0; j < 8; j++, selector >>= 6, delta_selector >>= 6)
        error += D6[(selector & 0xFC0) | (delta_selector & 0x3F)];
      if (error < min_error) {
        min_error = error;
        selected_index = i;
      }
    }
    selected_selector = selectors[selected_index];
    remapping[indices[selected_index]] = n - left;
    left--;
    selectors[selected_index] = selectors[left];
    indices[selected_index] = indices[left];
  }

  pack_alpha_selectors(m_packed_alpha_selectors, remapping);
}